

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wyhash.h
# Opt level: O3

uint64_t wyhash(void *key,uint64_t len,uint64_t seed)

{
  ulong *puVar1;
  ulong *puVar2;
  ulong *puVar3;
  ulong *puVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  ulong uVar53;
  ulong uVar54;
  uint64_t see1;
  ulong uVar55;
  uint64_t i;
  uint8_t *p;
  ulong uVar56;
  
  if (len == 0) {
    return 0;
  }
  uVar53 = seed;
  uVar55 = len;
  if (0x20 < len) {
    if (0x100 < len) {
      do {
        uVar55 = uVar55 - 0x100;
        auVar11._8_8_ = 0;
        auVar11._0_8_ = *(ulong *)((long)key + 8) ^ uVar53 ^ 0xe7037ed1a0b428db;
        auVar35._8_8_ = 0;
        auVar35._0_8_ = *key ^ uVar53 ^ 0xa0761d6478bd642f;
        auVar12._8_8_ = 0;
        auVar12._0_8_ = uVar53 ^ *(ulong *)((long)key + 0x18) ^ 0x589965cc75374cc3;
        auVar36._8_8_ = 0;
        auVar36._0_8_ = *(ulong *)((long)key + 0x10) ^ uVar53 ^ 0x8ebc6af09c88c6e3;
        auVar11 = auVar11 * auVar35 ^ auVar12 * auVar36;
        uVar56 = auVar11._8_8_ ^ auVar11._0_8_;
        auVar13._8_8_ = 0;
        auVar13._0_8_ = *(ulong *)((long)key + 0x28) ^ seed ^ 0x8ebc6af09c88c6e3;
        auVar37._8_8_ = 0;
        auVar37._0_8_ = *(ulong *)((long)key + 0x20) ^ seed ^ 0xe7037ed1a0b428db;
        auVar14._8_8_ = 0;
        auVar14._0_8_ = seed ^ *(ulong *)((long)key + 0x38) ^ 0xa0761d6478bd642f;
        auVar38._8_8_ = 0;
        auVar38._0_8_ = *(ulong *)((long)key + 0x30) ^ seed ^ 0x589965cc75374cc3;
        auVar11 = auVar13 * auVar37 ^ auVar14 * auVar38;
        uVar53 = auVar11._8_8_ ^ auVar11._0_8_;
        auVar15._8_8_ = 0;
        auVar15._0_8_ = *(ulong *)((long)key + 0x48) ^ uVar56 ^ 0xe7037ed1a0b428db;
        auVar39._8_8_ = 0;
        auVar39._0_8_ = *(ulong *)((long)key + 0x40) ^ uVar56 ^ 0xa0761d6478bd642f;
        auVar16._8_8_ = 0;
        auVar16._0_8_ = uVar56 ^ *(ulong *)((long)key + 0x58) ^ 0x589965cc75374cc3;
        auVar40._8_8_ = 0;
        auVar40._0_8_ = *(ulong *)((long)key + 0x50) ^ uVar56 ^ 0x8ebc6af09c88c6e3;
        auVar11 = auVar15 * auVar39 ^ auVar16 * auVar40;
        uVar56 = auVar11._8_8_ ^ auVar11._0_8_;
        auVar17._8_8_ = 0;
        auVar17._0_8_ = *(ulong *)((long)key + 0x68) ^ uVar53 ^ 0x8ebc6af09c88c6e3;
        auVar41._8_8_ = 0;
        auVar41._0_8_ = *(ulong *)((long)key + 0x60) ^ uVar53 ^ 0xe7037ed1a0b428db;
        auVar18._8_8_ = 0;
        auVar18._0_8_ = uVar53 ^ *(ulong *)((long)key + 0x78) ^ 0xa0761d6478bd642f;
        auVar42._8_8_ = 0;
        auVar42._0_8_ = *(ulong *)((long)key + 0x70) ^ uVar53 ^ 0x589965cc75374cc3;
        auVar11 = auVar17 * auVar41 ^ auVar18 * auVar42;
        uVar53 = auVar11._8_8_ ^ auVar11._0_8_;
        auVar19._8_8_ = 0;
        auVar19._0_8_ = *(ulong *)((long)key + 0x88) ^ uVar56 ^ 0xe7037ed1a0b428db;
        auVar43._8_8_ = 0;
        auVar43._0_8_ = *(ulong *)((long)key + 0x80) ^ uVar56 ^ 0xa0761d6478bd642f;
        auVar20._8_8_ = 0;
        auVar20._0_8_ = uVar56 ^ *(ulong *)((long)key + 0x98) ^ 0x589965cc75374cc3;
        auVar44._8_8_ = 0;
        auVar44._0_8_ = *(ulong *)((long)key + 0x90) ^ uVar56 ^ 0x8ebc6af09c88c6e3;
        auVar11 = auVar19 * auVar43 ^ auVar20 * auVar44;
        uVar54 = auVar11._8_8_ ^ auVar11._0_8_;
        auVar21._8_8_ = 0;
        auVar21._0_8_ = *(ulong *)((long)key + 0xa8) ^ uVar53 ^ 0x8ebc6af09c88c6e3;
        auVar45._8_8_ = 0;
        auVar45._0_8_ = *(ulong *)((long)key + 0xa0) ^ uVar53 ^ 0xe7037ed1a0b428db;
        auVar22._8_8_ = 0;
        auVar22._0_8_ = uVar53 ^ *(ulong *)((long)key + 0xb8) ^ 0xa0761d6478bd642f;
        auVar46._8_8_ = 0;
        auVar46._0_8_ = *(ulong *)((long)key + 0xb0) ^ uVar53 ^ 0x589965cc75374cc3;
        auVar11 = auVar21 * auVar45 ^ auVar22 * auVar46;
        uVar56 = auVar11._8_8_ ^ auVar11._0_8_;
        auVar23._8_8_ = 0;
        auVar23._0_8_ = *(ulong *)((long)key + 200) ^ uVar54 ^ 0xe7037ed1a0b428db;
        auVar47._8_8_ = 0;
        auVar47._0_8_ = *(ulong *)((long)key + 0xc0) ^ uVar54 ^ 0xa0761d6478bd642f;
        auVar24._8_8_ = 0;
        auVar24._0_8_ = uVar54 ^ *(ulong *)((long)key + 0xd8) ^ 0x589965cc75374cc3;
        auVar48._8_8_ = 0;
        auVar48._0_8_ = *(ulong *)((long)key + 0xd0) ^ uVar54 ^ 0x8ebc6af09c88c6e3;
        puVar1 = (ulong *)((long)key + 0xf0);
        auVar11 = auVar23 * auVar47 ^ auVar24 * auVar48;
        puVar2 = (ulong *)((long)key + 0xe0);
        uVar53 = auVar11._8_8_ ^ auVar11._0_8_;
        puVar3 = (ulong *)((long)key + 0xe8);
        puVar4 = (ulong *)((long)key + 0xf8);
        key = (void *)((long)key + 0x100);
        auVar25._8_8_ = 0;
        auVar25._0_8_ = *puVar3 ^ uVar56 ^ 0x8ebc6af09c88c6e3;
        auVar49._8_8_ = 0;
        auVar49._0_8_ = *puVar2 ^ uVar56 ^ 0xe7037ed1a0b428db;
        auVar26._8_8_ = 0;
        auVar26._0_8_ = uVar56 ^ *puVar4 ^ 0xa0761d6478bd642f;
        auVar50._8_8_ = 0;
        auVar50._0_8_ = *puVar1 ^ uVar56 ^ 0x589965cc75374cc3;
        auVar11 = auVar25 * auVar49 ^ auVar26 * auVar50;
        seed = auVar11._8_8_ ^ auVar11._0_8_;
      } while (0x100 < uVar55);
      if (uVar55 < 0x21) goto LAB_001063fd;
    }
    do {
      uVar56 = *key;
      puVar1 = (ulong *)((long)key + 0x10);
      uVar55 = uVar55 - 0x20;
      puVar2 = (ulong *)((long)key + 8);
      puVar3 = (ulong *)((long)key + 0x18);
      key = (void *)((long)key + 0x20);
      auVar27._8_8_ = 0;
      auVar27._0_8_ = uVar53 ^ *puVar2 ^ 0xe7037ed1a0b428db;
      auVar51._8_8_ = 0;
      auVar51._0_8_ = uVar56 ^ uVar53 ^ 0xa0761d6478bd642f;
      uVar53 = SUB168(auVar27 * auVar51,8) ^ SUB168(auVar27 * auVar51,0);
      auVar28._8_8_ = 0;
      auVar28._0_8_ = seed ^ *puVar3 ^ 0x589965cc75374cc3;
      auVar52._8_8_ = 0;
      auVar52._0_8_ = *puVar1 ^ seed ^ 0x8ebc6af09c88c6e3;
      seed = SUB168(auVar28 * auVar52,8) ^ SUB168(auVar28 * auVar52,0);
    } while (0x20 < uVar55);
  }
LAB_001063fd:
  if (uVar55 < 4) {
    auVar5._8_8_ = 0;
    auVar5._0_8_ = ((ulong)*(byte *)((long)key + (ulong)((int)uVar55 - 1)) |
                   (ulong)((uint)*(byte *)((long)key + (uVar55 >> 1)) << 8 |
                          (uint)(byte)*key << 0x10)) ^ 0xa0761d6478bd642f ^ uVar53;
    auVar29._8_8_ = 0;
    auVar29._0_8_ = uVar53 ^ 0xe7037ed1a0b428db;
    auVar5 = auVar5 * auVar29;
  }
  else {
    if (uVar55 < 9) {
      uVar56 = (ulong)(uint)*key;
      uVar55 = (ulong)*(uint *)((long)key + (uVar55 - 4));
    }
    else {
      if (0x10 < uVar55) {
        auVar8._8_8_ = 0;
        auVar8._0_8_ = CONCAT44((uint)*(ulong *)((long)key + 8),*(uint *)((long)key + 0xc)) ^
                       0xe7037ed1a0b428db ^ uVar53;
        auVar32._8_8_ = 0;
        auVar32._0_8_ = CONCAT44((uint)*key,*(uint *)((long)key + 4)) ^ 0xa0761d6478bd642f ^ uVar53;
        uVar53 = SUB168(auVar8 * auVar32,8) ^ SUB168(auVar8 * auVar32,0);
        if (uVar55 < 0x19) {
          auVar9._8_8_ = 0;
          auVar9._0_8_ = CONCAT44(*(undefined4 *)((long)key + (uVar55 - 8)),
                                  *(undefined4 *)((long)key + (uVar55 - 4))) ^ 0x8ebc6af09c88c6e3 ^
                         seed;
          auVar33._8_8_ = 0;
          auVar33._0_8_ = seed ^ 0x589965cc75374cc3;
          auVar9 = auVar9 * auVar33;
        }
        else {
          auVar10._8_8_ = 0;
          auVar10._0_8_ =
               CONCAT44(*(undefined4 *)((long)key + (uVar55 - 8)),
                        *(undefined4 *)((long)key + (uVar55 - 4))) ^ 0x589965cc75374cc3 ^ seed;
          auVar34._8_8_ = 0;
          auVar34._0_8_ =
               CONCAT44((uint)*(ulong *)((long)key + 0x10),*(uint *)((long)key + 0x14)) ^
               0x8ebc6af09c88c6e3 ^ seed;
          auVar9 = auVar10 * auVar34;
        }
        seed = auVar9._8_8_ ^ auVar9._0_8_;
        goto LAB_00106484;
      }
      uVar56 = CONCAT44((uint)*key,*(uint *)((long)key + 4));
      uVar55 = CONCAT44(*(undefined4 *)((long)key + (uVar55 - 8)),
                        *(undefined4 *)((long)key + (uVar55 - 4)));
    }
    auVar6._8_8_ = 0;
    auVar6._0_8_ = uVar55 ^ 0xe7037ed1a0b428db ^ uVar53;
    auVar30._8_8_ = 0;
    auVar30._0_8_ = uVar56 ^ 0xa0761d6478bd642f ^ uVar53;
    auVar5 = auVar6 * auVar30;
  }
  uVar53 = auVar5._8_8_ ^ auVar5._0_8_;
LAB_00106484:
  auVar7._8_8_ = 0;
  auVar7._0_8_ = uVar53 ^ seed;
  auVar31._8_8_ = 0;
  auVar31._0_8_ = len ^ 0x1d8e4e27c47d124f;
  return SUB168(auVar7 * auVar31,8) ^ SUB168(auVar7 * auVar31,0);
}

Assistant:

static	inline	uint64_t	__wyr8(const	uint8_t	*p)	{	return	(_wyr4(p)<<32)|_wyr4(p+4);	}